

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O3

double frechet_cdf_inv(double cdf,double alpha)

{
  char *pcVar1;
  double dVar2;
  
  if ((cdf < 0.0) || (1.0 < cdf)) {
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"FRECHET_CDF_INV - Fatal error!\n");
    pcVar1 = "  CDF < 0 or 1 < CDF.\n";
  }
  else {
    if (0.0 < alpha) {
      if ((cdf == 0.0) && (!NAN(cdf))) {
        return 0.0;
      }
      dVar2 = log(cdf);
      dVar2 = pow(-1.0 / dVar2,1.0 / alpha);
      return dVar2;
    }
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"FRECHET_CDF_INV - Fatal error!\n");
    pcVar1 = "  ALPHA <= 0.0.\n";
  }
  std::operator<<((ostream *)&std::cerr,pcVar1);
  exit(1);
}

Assistant:

double frechet_cdf_inv ( double cdf, double alpha )

//****************************************************************************80
//
//  Purpose:
//
//    FRECHET_CDF_INV inverts the Frechet CDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    02 September 2008
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double CDF, the value of the CDF.
//    0.0 <= CDF <= 1.0.
//
//    Input, double ALPHA, the parameter.
//    It is required that 0.0 < ALPHA.
//
//    Output, double FRECHET_CDF_INV, the corresponding argument of the CDF.
//
{
  double x;

  if ( cdf < 0.0 || 1.0 < cdf )
  {
    cerr << "\n";
    cerr << "FRECHET_CDF_INV - Fatal error!\n";
    cerr << "  CDF < 0 or 1 < CDF.\n";
    exit ( 1 );
  }

  if ( alpha <= 0.0 )
  {
    cerr << "\n";
    cerr << "FRECHET_CDF_INV - Fatal error!\n";
    cerr << "  ALPHA <= 0.0.\n";
    exit ( 1 );
  }

  if ( cdf == 0.0 )
  {
    x = 0.0;
  }
  else
  {
    x =  pow ( - 1.0 / log ( cdf ), 1.0 / alpha );
  }

  return x;
}